

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_core.hpp
# Opt level: O0

void __thiscall
asio::ssl::detail::stream_core::stream_core<asio::any_io_executor>
          (stream_core *this,SSL_CTX *context,any_io_executor *ex)

{
  time_point local_68;
  time_point local_60;
  mutable_buffer local_58;
  allocator<unsigned_char> local_41;
  mutable_buffer local_40;
  allocator<unsigned_char> local_2d [13];
  executor_type *local_20;
  any_io_executor *ex_local;
  SSL_CTX *context_local;
  stream_core *this_local;
  
  local_20 = ex;
  ex_local = (any_io_executor *)context;
  context_local = (SSL_CTX *)this;
  engine::engine(&this->engine_,context);
  basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
  ::basic_waitable_timer(&this->pending_read_,local_20);
  basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
  ::basic_waitable_timer(&this->pending_write_,local_20);
  std::allocator<unsigned_char>::allocator(local_2d);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&this->output_buffer_space_,0x4400,local_2d);
  std::allocator<unsigned_char>::~allocator(local_2d);
  local_40 = (mutable_buffer)
             buffer<unsigned_char,std::allocator<unsigned_char>>(&this->output_buffer_space_);
  (this->output_buffer_).data_ = local_40.data_;
  (this->output_buffer_).size_ = local_40.size_;
  std::allocator<unsigned_char>::allocator(&local_41);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&this->input_buffer_space_,0x4400,&local_41);
  std::allocator<unsigned_char>::~allocator(&local_41);
  local_58 = (mutable_buffer)
             buffer<unsigned_char,std::allocator<unsigned_char>>(&this->input_buffer_space_);
  (this->input_buffer_).data_ = local_58.data_;
  (this->input_buffer_).size_ = local_58.size_;
  const_buffer::const_buffer(&this->input_);
  local_60 = neg_infin();
  basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
  ::expires_at(&this->pending_read_,&local_60);
  local_68 = neg_infin();
  basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
  ::expires_at(&this->pending_write_,&local_68);
  return;
}

Assistant:

stream_core(SSL_CTX* context, const Executor& ex)
    : engine_(context),
      pending_read_(ex),
      pending_write_(ex),
      output_buffer_space_(max_tls_record_size),
      output_buffer_(asio::buffer(output_buffer_space_)),
      input_buffer_space_(max_tls_record_size),
      input_buffer_(asio::buffer(input_buffer_space_))
  {
    pending_read_.expires_at(neg_infin());
    pending_write_.expires_at(neg_infin());
  }